

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall
QDockAreaLayout::resizeDocks
          (QDockAreaLayout *this,QList<QDockWidget_*> *docks,QList<int> *sizes,Orientation o)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  QDockAreaLayoutInfo *pQVar4;
  pointer pQVar5;
  QSize QVar6;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *this_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  Representation RVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = (docks->d).size;
  if (lVar10 == (sizes->d).size) {
    this->fallbackToSizeHints = false;
    uVar9 = (uint)lVar10;
    if (0 < (int)uVar9) {
      uVar13 = 0;
      do {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        indexOf((QList<int> *)&local_58,this,&(docks->d).ptr[uVar13]->super_QWidget);
        if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
          local_78 = 2;
          local_74 = 0;
          uStack_6c = 0;
          local_64 = 0;
          local_60 = "default";
          QMessageLogger::warning
                    ((char *)&local_78,
                     "QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
        }
        else {
          iVar11 = (sizes->d).ptr[uVar13];
          if (iVar11 < 1) {
            local_78 = 2;
            local_74 = 0;
            uStack_6c = 0;
            local_64 = 0;
            local_60 = "default";
            QMessageLogger::warning
                      ((char *)&local_78,
                       "QMainWidget::resizeDocks: all sizes need to be larger than 0");
            iVar11 = 1;
          }
          for (; (undefined1 *)0x1 < (ulong)local_58.size; local_58.size = local_58.size + -1) {
            pQVar4 = info(this,(QList<int> *)&local_58);
            if ((pQVar4->tabbed == false) && (pQVar4->o == o)) {
              iVar8 = local_58.ptr[(long)(local_58.size + -1)];
              pQVar5 = QList<QDockAreaLayoutItem>::data(&pQVar4->item_list);
              pQVar5[iVar8].size = iVar11;
              lVar10 = (pQVar4->item_list).d.size;
              if (lVar10 == 0) {
                iVar11 = 0;
              }
              else {
                this_00 = (pQVar4->item_list).d.ptr;
                lVar10 = lVar10 * 0x28;
                iVar11 = 0;
                do {
                  bVar3 = QDockAreaLayoutItem::skip(this_00);
                  if (!bVar3) {
                    iVar8 = this->sep + iVar11;
                    if (iVar11 == 0) {
                      iVar8 = 0;
                    }
                    RVar12.m_i = this_00->size;
                    if (this_00->size == -1) {
                      QVar6 = QDockAreaLayoutItem::sizeHint(this_00);
                      RVar12.m_i = QVar6.ht.m_i.m_i;
                      if (o == Horizontal) {
                        RVar12.m_i = QVar6.wd.m_i.m_i;
                      }
                    }
                    iVar11 = RVar12.m_i + iVar8;
                  }
                  this_00 = this_00 + 1;
                  lVar10 = lVar10 + -0x28;
                } while (lVar10 != 0);
              }
            }
            if ((&(local_58.d)->super_QArrayData == (QArrayData *)0x0) ||
               (1 < ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QArrayDataPointer<int>::reallocateAndGrow
                        (&local_58,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
            }
          }
          iVar8 = *local_58.ptr;
          iVar1 = this->docks[iVar8].rect.x1.m_i;
          iVar2 = this->docks[iVar8].rect.y1.m_i;
          iVar7 = (this->docks[iVar8].rect.y2.m_i - iVar2) + 1;
          if (o != Horizontal) {
            iVar7 = iVar11;
            iVar11 = (this->docks[iVar8].rect.x2.m_i - iVar1) + 1;
          }
          this->docks[iVar8].rect.x2.m_i = iVar11 + iVar1 + -1;
          this->docks[iVar8].rect.y2.m_i = iVar2 + iVar7 + -1;
        }
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,4,0x10);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uVar9 & 0x7fffffff));
    }
  }
  else {
    resizeDocks();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::resizeDocks(const QList<QDockWidget *> &docks,
                                  const QList<int> &sizes, Qt::Orientation o)
{
    if (Q_UNLIKELY(docks.size() != sizes.size())) {
        qWarning("QMainWidget::resizeDocks: size of the lists are not the same");
        return;
    }
    int count = docks.size();
    fallbackToSizeHints = false;
    for (int i = 0; i < count; ++i) {
        QList<int> path = indexOf(docks[i]);
        if (Q_UNLIKELY(path.isEmpty())) {
            qWarning("QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
            continue;
        }
        int size = sizes[i];
        if (Q_UNLIKELY(size <= 0)) {
            qWarning("QMainWidget::resizeDocks: all sizes need to be larger than 0");
            size = 1;
        }

        while (path.size() > 1) {
            QDockAreaLayoutInfo *info = this->info(path);
#if QT_CONFIG(tabbar)
            if (!info->tabbed && info->o == o) {
                info->item_list[path.constLast()].size = size;
                int totalSize = 0;
                for (const QDockAreaLayoutItem &item : std::as_const(info->item_list)) {
                    if (!item.skip()) {
                        if (totalSize != 0)
                            totalSize += sep;
                        totalSize += item.size == -1 ? pick(o, item.sizeHint()) : item.size;
                    }
                }
                size = totalSize;
            }
#endif // QT_CONFIG(tabbar)
            path.removeLast();
        }

        const int dockNum = path.constFirst();
        Q_ASSERT(dockNum < QInternal::DockCount);
        QRect &r = this->docks[dockNum].rect;
        QSize s = r.size();
        rpick(o, s) = size;
        r.setSize(s);
    }
}